

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void draw_8_handles_for_rect
               (int left,int top,int width,int height,bool filled,Am_Drawonable *draw,
               Am_Style *style,Am_Object *handle_shape,Am_Style *special_style,
               Am_Move_Grow_Where_Attach special_style_where)

{
  Am_Drawonable *pAVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Am_Style *local_1c8;
  Am_Style *local_1a0;
  Am_Style *local_178;
  Am_Style *local_150;
  Am_Style *local_128;
  Am_Style *local_100;
  Am_Style *local_d8;
  Am_Style *local_b0;
  Am_Style local_80;
  Am_Style local_78;
  Am_Style local_70;
  Am_Style local_68;
  Am_Style local_60;
  Am_Style local_58;
  Am_Style local_50 [3];
  Am_Style local_38;
  int local_30;
  int local_2c;
  int height_d2;
  int width_d2;
  Am_Drawonable *draw_local;
  int iStack_18;
  bool filled_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Move_Grow_Where_Attach special_style_where_local;
  
  top_local = special_style_where.value;
  local_2c = width / 2;
  local_30 = height / 2;
  _height_d2 = draw;
  draw_local._3_1_ = filled;
  draw_local._4_4_ = height;
  iStack_18 = width;
  height_local = top;
  width_local = left;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_NW);
  if (bVar3) {
    local_b0 = special_style;
  }
  else {
    local_b0 = style;
  }
  Am_Style::Am_Style(&local_38,local_b0);
  draw_handle(left,top,filled,draw,&local_38,handle_shape);
  Am_Style::~Am_Style(&local_38);
  iVar5 = width_local;
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar4 = height_local + local_30;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_W);
  if (bVar3) {
    local_d8 = special_style;
  }
  else {
    local_d8 = style;
  }
  Am_Style::Am_Style(local_50,local_d8);
  draw_handle(iVar5,iVar4 + -7,(bool)(bVar2 & 1),pAVar1,local_50,handle_shape);
  Am_Style::~Am_Style(local_50);
  iVar5 = width_local;
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar4 = height_local + draw_local._4_4_;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_SW);
  if (bVar3) {
    local_100 = special_style;
  }
  else {
    local_100 = style;
  }
  Am_Style::Am_Style(&local_58,local_100);
  draw_handle(iVar5,iVar4 + -0xd,(bool)(bVar2 & 1),pAVar1,&local_58,handle_shape);
  Am_Style::~Am_Style(&local_58);
  iVar5 = height_local;
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar4 = width_local + local_2c;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_N);
  if (bVar3) {
    local_128 = special_style;
  }
  else {
    local_128 = style;
  }
  Am_Style::Am_Style(&local_60,local_128);
  draw_handle(iVar4 + -7,iVar5,(bool)(bVar2 & 1),pAVar1,&local_60,handle_shape);
  Am_Style::~Am_Style(&local_60);
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar5 = width_local + local_2c;
  iVar4 = height_local + draw_local._4_4_;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_S);
  if (bVar3) {
    local_150 = special_style;
  }
  else {
    local_150 = style;
  }
  Am_Style::Am_Style(&local_68,local_150);
  draw_handle(iVar5 + -7,iVar4 + -0xd,(bool)(bVar2 & 1),pAVar1,&local_68,handle_shape);
  Am_Style::~Am_Style(&local_68);
  iVar5 = height_local;
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar4 = width_local + iStack_18;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_NE);
  if (bVar3) {
    local_178 = special_style;
  }
  else {
    local_178 = style;
  }
  Am_Style::Am_Style(&local_70,local_178);
  draw_handle(iVar4 + -0xd,iVar5,(bool)(bVar2 & 1),pAVar1,&local_70,handle_shape);
  Am_Style::~Am_Style(&local_70);
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar5 = width_local + iStack_18;
  iVar4 = height_local + local_30;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_E);
  if (bVar3) {
    local_1a0 = special_style;
  }
  else {
    local_1a0 = style;
  }
  Am_Style::Am_Style(&local_78,local_1a0);
  draw_handle(iVar5 + -0xd,iVar4 + -7,(bool)(bVar2 & 1),pAVar1,&local_78,handle_shape);
  Am_Style::~Am_Style(&local_78);
  bVar2 = draw_local._3_1_;
  pAVar1 = _height_d2;
  iVar5 = width_local + iStack_18;
  iVar4 = height_local + draw_local._4_4_;
  bVar3 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&top_local,&Am_ATTACH_SE);
  if (bVar3) {
    local_1c8 = special_style;
  }
  else {
    local_1c8 = style;
  }
  Am_Style::Am_Style(&local_80,local_1c8);
  draw_handle(iVar5 + -0xd,iVar4 + -0xd,(bool)(bVar2 & 1),pAVar1,&local_80,handle_shape);
  Am_Style::~Am_Style(&local_80);
  return;
}

Assistant:

void
draw_8_handles_for_rect(
    int left, int top, int width, int height, bool filled, Am_Drawonable *draw,
    Am_Style style,
    Am_Object &handle_shape, //supports multiple users
    Am_Style special_style = Am_No_Style,
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT // 0
    )
{
  int width_d2 = width / 2;
  int height_d2 = height / 2;

  // left-top
  draw_handle(left, top, filled, draw,
              (special_style_where == Am_ATTACH_NW) ? special_style : style,
              handle_shape); //supports multiple users
  //left-middle
  draw_handle(left, top + height_d2 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_W) ? special_style : style,
              handle_shape); //supports multiple users
  //left-bottom
  draw_handle(left, top + height - HANDLE_SIZE, filled, draw,
              (special_style_where == Am_ATTACH_SW) ? special_style : style,
              handle_shape); //supports multiple users

  // middle-top
  draw_handle(left + width_d2 - HANDLE_SIZE_D2, top, filled, draw,
              (special_style_where == Am_ATTACH_N) ? special_style : style,
              handle_shape); //supports multiple users
  //middle-bottom
  draw_handle(left + width_d2 - HANDLE_SIZE_D2, top + height - HANDLE_SIZE,
              filled, draw,
              (special_style_where == Am_ATTACH_S) ? special_style : style,
              handle_shape); //supports multiple users

  // right-top
  draw_handle(left + width - HANDLE_SIZE, top, filled, draw,
              (special_style_where == Am_ATTACH_NE) ? special_style : style,
              handle_shape); //supports multiple users

  // right-middle
  draw_handle(left + width - HANDLE_SIZE, top + height_d2 - HANDLE_SIZE_D2,
              filled, draw,
              (special_style_where == Am_ATTACH_E) ? special_style : style,
              handle_shape); //supports multiple users
  // right-bottom
  draw_handle(left + width - HANDLE_SIZE, top + height - HANDLE_SIZE, filled,
              draw,
              (special_style_where == Am_ATTACH_SE) ? special_style : style,
              handle_shape); //supports multiple users
}